

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O0

void __thiscall Constraint::Constraint(Constraint *this)

{
  shared_ptr<Expression> *in_RDI;
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Expression *unaff_retaddr;
  Expression *in_stack_ffffffffffffffc8;
  
  dVar1 = std::numeric_limits<double>::infinity();
  (in_RDI->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)((ulong)dVar1 ^ 0x8000000000000000);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::numeric_limits<double>::infinity();
  (in_RDI->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
  operator_new(0x58);
  Expression::Expression(unaff_retaddr);
  std::shared_ptr<Expression>::shared_ptr<Expression,void>(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Constraint() : expr(std::shared_ptr<Expression>(new Expression)){}